

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
ezc3d::c3d::pointNames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,c3d *this)

{
  Parameters *pPVar1;
  bool bVar2;
  Group *pGVar3;
  Parameter *pPVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  int __val;
  allocator<char> local_99;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  pPVar1 = (this->_parameters).
           super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"POINT",(allocator<char> *)&local_50);
  pGVar3 = ParametersNS::Parameters::group(pPVar1,&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"LABELS",&local_99);
  pPVar4 = ParametersNS::GroupNS::Group::parameter(pGVar3,&local_90);
  pvVar5 = ParametersNS::GroupNS::Parameter::valuesAsString_abi_cxx11_(pPVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_98,pvVar5);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  __val = 2;
  while( true ) {
    pPVar1 = (this->_parameters).
             super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"POINT",&local_99);
    pGVar3 = ParametersNS::Parameters::group(pPVar1,&local_70);
    std::__cxx11::to_string(&local_50,__val);
    std::operator+(&local_90,"LABELS",&local_50);
    bVar2 = ParametersNS::GroupNS::Group::isParameter(pGVar3,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar2) break;
    pPVar1 = (this->_parameters).
             super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"POINT",&local_99);
    pGVar3 = ParametersNS::Parameters::group(pPVar1,&local_70);
    std::__cxx11::to_string(&local_50,__val);
    std::operator+(&local_90,"LABELS",&local_50);
    pPVar4 = ParametersNS::GroupNS::Group::parameter(pGVar3,&local_90);
    pvVar5 = ParametersNS::GroupNS::Parameter::valuesAsString_abi_cxx11_(pPVar4);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              (local_98,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         (local_98 + 8),
               (pvVar5->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (pvVar5->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    __val = __val + 1;
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_98;
}

Assistant:

const std::vector<std::string> ezc3d::c3d::pointNames() const {
  std::vector<std::string> labels =
      parameters().group("POINT").parameter("LABELS").valuesAsString();
  int i = 2;
  while (
      parameters().group("POINT").isParameter("LABELS" + std::to_string(i))) {
    const std::vector<std::string> &labels_tp =
        parameters()
            .group("POINT")
            .parameter("LABELS" + std::to_string(i))
            .valuesAsString();
    labels.insert(labels.end(), labels_tp.begin(), labels_tp.end());
    ++i;
  }
  return labels;
}